

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::ClearAllHighlights(BoardView *this)

{
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<Component> part;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  FindNet(this,"");
  FindComponent(this,"");
  ResetSearch(this);
  this->m_needsRedraw = true;
  if (this->m_board != (Board *)0x0) {
    iVar2 = (*this->m_board->_vptr_Board[3])();
    p_Var1 = (__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)
             ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
    for (p_Var3 = *(__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> **)
                   CONCAT44(extraout_var,iVar2); p_Var3 != p_Var1; p_Var3 = p_Var3 + 1) {
      std::__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_38,p_Var3);
      (local_38._M_ptr)->visualmode = '\0';
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    }
  }
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
            (&this->m_partHighlighted);
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
            (&this->m_pinHighlighted);
  return;
}

Assistant:

void BoardView::ClearAllHighlights(void) {
	m_pinSelected = nullptr;
	FindNet("");
	FindComponent("");
	ResetSearch();
	m_needsRedraw      = true;
	if (m_board != NULL) {
		for (auto part : m_board->Components()) part->visualmode = part->CVMNormal;
	}
	m_partHighlighted.clear();
	m_pinHighlighted.clear();
}